

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::Phase<std::complex<float>_>::matrix(Phase<std::complex<float>_> *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<float>_> SVar3;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)0x2;
  puVar2 = (undefined8 *)operator_new__(0x20);
  *(undefined8 **)&(this->super_QGate1<std::complex<float>_>).qubit_ = puVar2;
  *puVar2 = 0x3f800000;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = uVar1;
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( T(1) , T(0) ,
                                                  T(0) , T( cos() , sin() ) ) ;
        }